

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_HashCallExpr_Test::~ExprTest_HashCallExpr_Test(ExprTest_HashCallExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_HashCallExpr_Test((ExprTest_HashCallExpr_Test *)0x14b4a8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, HashCallExpr) {
  mp::Reference var = MakeVariable(9);
  mp::NumericExpr n1 = MakeConst(1);
  Expr args[2] = {n1, var};
  mp::Function f = factory_.AddFunction("foo", 2, mp::func::SYMBOLIC);
  size_t hash = HashCombine<int>(0, expr::CALL);
  hash = HashCombine(hash, f.name());
  hash = HashCombine<Expr>(hash, n1);
  hash = HashCombine<Expr>(hash, var);
  EXPECT_EQ(hash, ExprHash()(MakeCall(f, args)));
}